

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCEXP.hpp
# Opt level: O1

int __thiscall
CCEXP::CCEXPMat<unsigned_long>::AddValue(CCEXPMat<unsigned_long> *this,unsigned_long val)

{
  pointer pMVar1;
  ulong new_elements_;
  MVECTOR<unsigned_long> dl;
  value_type local_60;
  
  if (this->IgnoreM == false) {
    if (((this->data).
         super__Vector_base<ns_MVECTOR::MVECTOR<unsigned_long>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_finish ==
         (this->data).
         super__Vector_base<ns_MVECTOR::MVECTOR<unsigned_long>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_start) || (this->newRowFlag == true)) {
      ns_MVECTOR::MVECTOR_Base::MVECTOR_Base(&local_60.super_MVECTOR_Base);
      local_60.sptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_60.sptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_60.step_elements_back = 0x2800;
      local_60.step_elements = 0x400;
      local_60.dbg = 0;
      local_60.pdata._4_4_ = 0;
      local_60.pdata._0_4_ = 0;
      local_60.mem_elements = 0;
      local_60.elements._4_4_ = 0;
      local_60.elements._0_4_ = 0;
      std::
      vector<ns_MVECTOR::MVECTOR<unsigned_long>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_long>_>_>
      ::push_back(&this->data,&local_60);
      this->newRowFlag = false;
      ns_MVECTOR::MVECTOR<unsigned_long>::~MVECTOR(&local_60);
    }
    pMVar1 = (this->data).
             super__Vector_base<ns_MVECTOR::MVECTOR<unsigned_long>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    new_elements_ = pMVar1[-1].elements + 1;
    pMVar1[-1].elements = new_elements_;
    if (pMVar1[-1].mem_elements <= new_elements_) {
      ns_MVECTOR::MVECTOR<unsigned_long>::resize(pMVar1 + -1,new_elements_);
    }
    pMVar1[-1].pdata[pMVar1[-1].elements - 1] = val;
  }
  return 0;
}

Assistant:

int CCEXPMat<T>::AddValue(T val) {
	if (IgnoreM) return 0; // This is not an error - We just ignore the Table...
	const size_t N = data.size();
	if ((N == 0) || (newRowFlag==true)) {
		MVECTOR<T> dl; dl.clear(); data.push_back(dl);
		newRowFlag = false;
	}
	data.back().push_back(val);
	return 0;
}